

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void percolate_down(roaring_pq_t *pq,uint32_t i)

{
  _Bool _Var1;
  uint uVar2;
  roaring_pq_element_t *prVar3;
  undefined1 local_58 [8];
  roaring_pq_element_t bestc;
  uint32_t r;
  uint32_t l;
  roaring_pq_element_t ai;
  uint32_t hsize;
  uint32_t size;
  uint32_t i_local;
  roaring_pq_t *pq_local;
  
  uVar2 = (uint)pq->size;
  ai.bitmap._4_4_ = uVar2 >> 1;
  prVar3 = pq->elements + i;
  _r = prVar3->size;
  ai.size = *(uint64_t *)&prVar3->is_temporary;
  ai._8_8_ = prVar3->bitmap;
  hsize = i;
  while (hsize < ai.bitmap._4_4_) {
    bestc.bitmap._4_4_ = hsize * 2 + 1;
    bestc.bitmap._0_4_ = hsize * 2 + 2;
    prVar3 = pq->elements + bestc.bitmap._4_4_;
    local_58 = (undefined1  [8])prVar3->size;
    bestc.size = *(uint64_t *)&prVar3->is_temporary;
    bestc._8_8_ = prVar3->bitmap;
    if (((uint)bestc.bitmap < uVar2) &&
       (_Var1 = compare(pq->elements + (uint)bestc.bitmap,(roaring_pq_element_t *)local_58), _Var1))
    {
      bestc.bitmap._4_4_ = (uint)bestc.bitmap;
      prVar3 = pq->elements + (uint)bestc.bitmap;
      local_58 = (undefined1  [8])prVar3->size;
      bestc.size = *(uint64_t *)&prVar3->is_temporary;
      bestc._8_8_ = prVar3->bitmap;
    }
    _Var1 = compare((roaring_pq_element_t *)local_58,(roaring_pq_element_t *)&r);
    if (!_Var1) break;
    prVar3 = pq->elements + hsize;
    prVar3->size = (uint64_t)local_58;
    *(uint64_t *)&prVar3->is_temporary = bestc.size;
    prVar3->bitmap = (roaring_bitmap_t *)bestc._8_8_;
    hsize = bestc.bitmap._4_4_;
  }
  prVar3 = pq->elements + hsize;
  prVar3->size = _r;
  *(uint64_t *)&prVar3->is_temporary = ai.size;
  prVar3->bitmap = (roaring_bitmap_t *)ai._8_8_;
  return;
}

Assistant:

static void percolate_down(roaring_pq_t *pq, uint32_t i) {
    uint32_t size = (uint32_t)pq->size;
    uint32_t hsize = size >> 1;
    roaring_pq_element_t ai = pq->elements[i];
    while (i < hsize) {
        uint32_t l = (i << 1) + 1;
        uint32_t r = l + 1;
        roaring_pq_element_t bestc = pq->elements[l];
        if (r < size) {
            if (compare(pq->elements + r, &bestc)) {
                l = r;
                bestc = pq->elements[r];
            }
        }
        if (!compare(&bestc, &ai)) {
            break;
        }
        pq->elements[i] = bestc;
        i = l;
    }
    pq->elements[i] = ai;
}